

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O2

void __thiscall QPDFJob::copyAttachments(QPDFJob *this,QPDF *pdf)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  pointer pbVar1;
  _Alloc_hider _Var2;
  bool bVar3;
  _Base_ptr p_Var4;
  runtime_error *this_00;
  list<QPDFJob::CopyAttachmentFrom,_std::allocator<QPDFJob::CopyAttachmentFrom>_> *plVar5;
  iterator __begin2;
  pointer pbVar6;
  iterator __end2;
  unique_ptr<QPDF,_std::default_delete<QPDF>_> other;
  list<QPDFJob::CopyAttachmentFrom,_std::allocator<QPDFJob::CopyAttachmentFrom>_> *local_1e0;
  QPDFObjectHandle new_fs_oh;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  duplicates;
  string message;
  QPDFEmbeddedFileDocumentHelper other_efdh;
  _Any_data local_120;
  code *local_110;
  code *local_108;
  _Any_data local_100;
  code *local_f0;
  code *local_e8;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_e0;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_d0;
  string new_key;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>_>_>_>
  other_attachments;
  QPDFEmbeddedFileDocumentHelper efdh;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&message,"/UseAttachments",(allocator<char> *)&other_attachments);
  maybe_set_pagemode(pdf,&message);
  std::__cxx11::string::~string((string *)&message);
  QPDFEmbeddedFileDocumentHelper::QPDFEmbeddedFileDocumentHelper(&efdh,pdf);
  duplicates.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  duplicates.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  duplicates.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  plVar5 = &((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            attachments_to_copy;
  local_1e0 = plVar5;
  while( true ) {
    pbVar1 = duplicates.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_1e0 = *(list<QPDFJob::CopyAttachmentFrom,_std::allocator<QPDFJob::CopyAttachmentFrom>_> **
                 )&(local_1e0->
                   super__List_base<QPDFJob::CopyAttachmentFrom,_std::allocator<QPDFJob::CopyAttachmentFrom>_>
                   )._M_impl._M_node.super__List_node_base;
    if (local_1e0 == plVar5) break;
    local_120._8_8_ = 0;
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            &(local_1e0->
             super__List_base<QPDFJob::CopyAttachmentFrom,_std::allocator<QPDFJob::CopyAttachmentFrom>_>
             )._M_impl._M_node._M_size;
    local_108 = std::
                _Function_handler<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDFJob.cc:2139:21)>
                ::_M_invoke;
    local_110 = std::
                _Function_handler<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDFJob.cc:2139:21)>
                ::_M_manager;
    local_120._M_unused._M_object = __rhs;
    doIfVerbose(this,(function<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)&local_120);
    std::_Function_base::~_Function_base((_Function_base *)&local_120);
    other._M_t.super___uniq_ptr_impl<QPDF,_std::default_delete<QPDF>_>._M_t.
    super__Tuple_impl<0UL,_QPDF_*,_std::default_delete<QPDF>_>.super__Head_base<0UL,_QPDF_*,_false>.
    _M_head_impl = (__uniq_ptr_data<QPDF,_std::default_delete<QPDF>,_true,_true>)
                   (__uniq_ptr_impl<QPDF,_std::default_delete<QPDF>_>)0x0;
    processFile(this,&other,
                (char *)(local_1e0->
                        super__List_base<QPDFJob::CopyAttachmentFrom,_std::allocator<QPDFJob::CopyAttachmentFrom>_>
                        )._M_impl._M_node._M_size,(char *)*(_Base_ptr *)(local_1e0 + 2),false,false)
    ;
    QPDFEmbeddedFileDocumentHelper::QPDFEmbeddedFileDocumentHelper
              (&other_efdh,
               (QPDF *)other._M_t.super___uniq_ptr_impl<QPDF,_std::default_delete<QPDF>_>._M_t.
                       super__Tuple_impl<0UL,_QPDF_*,_std::default_delete<QPDF>_>.
                       super__Head_base<0UL,_QPDF_*,_false>._M_head_impl);
    QPDFEmbeddedFileDocumentHelper::getEmbeddedFiles_abi_cxx11_(&other_attachments,&other_efdh);
    for (p_Var4 = other_attachments._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var4 != &other_attachments._M_t._M_impl.super__Rb_tree_header;
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
      std::operator+(&new_key,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)(local_1e0 + 3) + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (p_Var4 + 1));
      QPDFEmbeddedFileDocumentHelper::getEmbeddedFile
                ((QPDFEmbeddedFileDocumentHelper *)&message,(string *)&efdh);
      _Var2 = message._M_dataplus;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&message._M_string_length);
      if (_Var2._M_p == (pointer)0x0) {
        std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_d0,
                   (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
                   (*(long *)(p_Var4 + 2) + 8));
        QPDF::copyForeignObject((QPDF *)&new_fs_oh,(QPDFObjectHandle *)pdf);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d0._M_refcount);
        std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_e0,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&new_fs_oh);
        QPDFFileSpecObjectHelper::QPDFFileSpecObjectHelper
                  ((QPDFFileSpecObjectHelper *)&message,(QPDFObjectHandle *)&local_e0);
        QPDFEmbeddedFileDocumentHelper::replaceEmbeddedFile
                  (&efdh,&new_key,(QPDFFileSpecObjectHelper *)&message);
        QPDFFileSpecObjectHelper::~QPDFFileSpecObjectHelper((QPDFFileSpecObjectHelper *)&message);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_e0._M_refcount);
        local_e8 = std::
                   _Function_handler<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDFJob.cc:2153:29)>
                   ::_M_invoke;
        local_f0 = std::
                   _Function_handler<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDFJob.cc:2153:29)>
                   ::_M_manager;
        local_100._M_unused._M_object = p_Var4 + 1;
        local_100._8_8_ = &new_key;
        doIfVerbose(this,(function<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                          *)&local_100);
        std::_Function_base::~_Function_base((_Function_base *)&local_100);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&new_fs_oh.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      }
      else {
        std::operator+(&local_50,"file: ",__rhs);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &new_fs_oh,&local_50,", key: ");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&message
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &new_fs_oh,&new_key);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&duplicates,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&message);
        std::__cxx11::string::~string((string *)&message);
        std::__cxx11::string::~string((string *)&new_fs_oh);
        std::__cxx11::string::~string((string *)&local_50);
      }
      std::__cxx11::string::~string((string *)&new_key);
    }
    bVar3 = QPDF::anyWarnings((QPDF *)other._M_t.
                                      super___uniq_ptr_impl<QPDF,_std::default_delete<QPDF>_>._M_t.
                                      super__Tuple_impl<0UL,_QPDF_*,_std::default_delete<QPDF>_>.
                                      super__Head_base<0UL,_QPDF_*,_false>._M_head_impl);
    if (bVar3) {
      ((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->warnings
           = true;
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>_>_>_>
    ::~_Rb_tree(&other_attachments._M_t);
    QPDFEmbeddedFileDocumentHelper::~QPDFEmbeddedFileDocumentHelper(&other_efdh);
    std::unique_ptr<QPDF,_std::default_delete<QPDF>_>::~unique_ptr(&other);
  }
  if (duplicates.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      duplicates.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&duplicates);
    QPDFEmbeddedFileDocumentHelper::~QPDFEmbeddedFileDocumentHelper(&efdh);
    return;
  }
  message._M_dataplus._M_p = (pointer)&message.field_2;
  message._M_string_length = 0;
  message.field_2._M_local_buf[0] = '\0';
  for (pbVar6 = duplicates.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar6 != pbVar1; pbVar6 = pbVar6 + 1) {
    if (message._M_string_length != 0) {
      std::__cxx11::string::append((char *)&message);
    }
    std::__cxx11::string::append((string *)&message);
  }
  QPDF::getFilename_abi_cxx11_((string *)&new_fs_oh,pdf);
  std::operator+(&new_key,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &new_fs_oh,
                 " already has attachments with keys that conflict with attachments from other files: "
                );
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&other_efdh,
                 &new_key,&message);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &other_attachments,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&other_efdh,
                 ". Use --prefix with --copy-attachments-from or manually copy individual attachments."
                );
  std::__cxx11::string::operator=((string *)&message,(string *)&other_attachments);
  std::__cxx11::string::~string((string *)&other_attachments);
  std::__cxx11::string::~string((string *)&other_efdh);
  std::__cxx11::string::~string((string *)&new_key);
  std::__cxx11::string::~string((string *)&new_fs_oh);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,(string *)&message);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void
QPDFJob::copyAttachments(QPDF& pdf)
{
    maybe_set_pagemode(pdf, "/UseAttachments");
    QPDFEmbeddedFileDocumentHelper efdh(pdf);
    std::vector<std::string> duplicates;
    for (auto const& to_copy: m->attachments_to_copy) {
        doIfVerbose([&](Pipeline& v, std::string const& prefix) {
            v << prefix << ": copying attachments from " << to_copy.path << "\n";
        });
        std::unique_ptr<QPDF> other;
        processFile(other, to_copy.path.c_str(), to_copy.password.c_str(), false, false);
        QPDFEmbeddedFileDocumentHelper other_efdh(*other);
        auto other_attachments = other_efdh.getEmbeddedFiles();
        for (auto const& iter: other_attachments) {
            std::string new_key = to_copy.prefix + iter.first;
            if (efdh.getEmbeddedFile(new_key)) {
                duplicates.push_back("file: " + to_copy.path + ", key: " + new_key);
            } else {
                auto new_fs_oh = pdf.copyForeignObject(iter.second->getObjectHandle());
                efdh.replaceEmbeddedFile(new_key, QPDFFileSpecObjectHelper(new_fs_oh));
                doIfVerbose([&](Pipeline& v, std::string const& prefix) {
                    v << "  " << iter.first << " -> " << new_key << "\n";
                });
            }
        }

        if (other->anyWarnings()) {
            m->warnings = true;
        }
    }

    if (!duplicates.empty()) {
        std::string message;
        for (auto const& i: duplicates) {
            if (!message.empty()) {
                message += "; ";
            }
            message += i;
        }
        message = pdf.getFilename() +
            " already has attachments with keys that conflict with attachments from other files: " +
            message +
            ". Use --prefix with --copy-attachments-from or manually copy individual attachments.";
        throw std::runtime_error(message);
    }
}